

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::insert_torrent
          (session_impl *this,info_hash_t *ih,shared_ptr<libtorrent::aux::torrent> *t)

{
  element_type *this_00;
  shared_ptr<libtorrent::aux::torrent> local_30;
  __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  shared_ptr<libtorrent::aux::torrent> *t_local;
  info_hash_t *ih_local;
  session_impl *this_local;
  
  local_20 = (__shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)t;
  t_local = (shared_ptr<libtorrent::aux::torrent> *)ih;
  ih_local = (info_hash_t *)this;
  ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr(&local_30,t);
  torrent_list<libtorrent::aux::torrent>::insert(&this->m_torrents,ih,&local_30);
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr(&local_30);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(local_20);
  torrent::added(this_00);
  return;
}

Assistant:

void session_impl::insert_torrent(info_hash_t const& ih, std::shared_ptr<torrent> const& t)
	{
		m_torrents.insert(ih, t);
		t->added();
	}